

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptorProto::ServiceDescriptorProto(ServiceDescriptorProto *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  InternalMetadataWithArena *in_stack_ffffffffffffffc0;
  ServiceDescriptorProto *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__ServiceDescriptorProto_00958870;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x512b32);
  this_00 = (ServiceDescriptorProto *)(in_RDI + 3);
  RepeatedPtrField<google::protobuf::MethodDescriptorProto>::RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)0x512b45);
  SharedCtor(this_00);
  return;
}

Assistant:

ServiceDescriptorProto::ServiceDescriptorProto()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.ServiceDescriptorProto)
}